

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalNinjaGenerator::WriteTargetAliases(cmGlobalNinjaGenerator *this,ostream *os)

{
  _Rb_tree_header *p_Var1;
  long *plVar2;
  pointer pbVar3;
  pointer pbVar4;
  iterator iVar5;
  _Base_ptr p_Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer pbVar8;
  cmNinjaBuild build;
  char *local_158;
  size_type local_150;
  char local_148 [8];
  undefined8 uStack_140;
  undefined1 local_138 [64];
  pointer local_f8;
  pointer pbStack_f0;
  pointer local_e8;
  pointer pbStack_e0;
  pointer local_d8;
  pointer pbStack_d0;
  cmNinjaDeps local_c8;
  pointer pbStack_b0;
  pointer local_a8;
  pointer pbStack_a0;
  pointer local_98;
  pointer pbStack_90;
  pointer local_88;
  _Rb_tree_node_base local_78;
  size_t local_58;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"# =============================================================================\n",
             0x50);
  std::__ostream_insert<char,std::char_traits<char>>(os,"# Target aliases.\n\n",0x13);
  local_158 = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"phony","");
  local_138._0_8_ = local_138 + 0x10;
  local_138._8_8_ = 0;
  local_138[0x10] = '\0';
  local_138._32_8_ = local_138 + 0x30;
  if (local_158 == local_148) {
    local_138._56_8_ = uStack_140;
  }
  else {
    local_138._32_8_ = local_158;
  }
  local_138._40_8_ = local_150;
  local_150 = 0;
  local_148[0] = '\0';
  local_78._M_left = &local_78;
  local_78._M_color = _S_red;
  local_78._M_parent = (_Base_ptr)0x0;
  local_f8 = (pointer)0x0;
  pbStack_f0 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  pbStack_e0 = (pointer)0x0;
  local_d8 = (pointer)0x0;
  pbStack_d0 = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbStack_b0 = (pointer)0x0;
  local_a8 = (pointer)0x0;
  pbStack_a0 = (pointer)0x0;
  local_98 = (pointer)0x0;
  pbStack_90 = (pointer)0x0;
  local_88 = (pointer)0x0;
  local_58 = 0;
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_158 = local_148;
  local_78._M_right = local_78._M_left;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
             (char (*) [1])0x550d1e);
  p_Var6 = (this->TargetAliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->TargetAliases)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      if (*(long *)(p_Var6 + 2) != 0) {
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&(this->CustomCommandOutputs)._M_t,(key_type *)(p_Var6 + 1));
        if ((_Rb_tree_header *)iVar5._M_node ==
            &(this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header) {
          std::__cxx11::string::_M_assign((string *)local_f8);
          pbVar4 = local_c8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar3 = local_c8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (local_c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar7 = &(local_c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar7 + -1))->_M_dataplus)._M_p;
              if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)plVar2) {
                operator_delete(plVar2,paVar7->_M_allocated_capacity + 1);
              }
              pbVar8 = (pointer)(paVar7 + 1);
              paVar7 = paVar7 + 2;
            } while (pbVar8 != pbVar4);
            local_c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
          }
          AppendTargetOutputs(this,*(cmGeneratorTarget **)(p_Var6 + 2),&local_c8,
                              DependOnTargetArtifact);
          WriteBuild(this,os,(cmNinjaBuild *)local_138,0,(bool *)0x0);
        }
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_138);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetAliases(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << "# Target aliases.\n\n";

  cmNinjaBuild build("phony");
  build.Outputs.emplace_back("");
  for (auto const& ta : TargetAliases) {
    // Don't write ambiguous aliases.
    if (!ta.second) {
      continue;
    }

    // Don't write alias if there is a already a custom command with
    // matching output
    if (this->HasCustomCommandOutput(ta.first)) {
      continue;
    }

    // Outputs
    build.Outputs[0] = ta.first;
    // Explicit depdendencies
    build.ExplicitDeps.clear();
    this->AppendTargetOutputs(ta.second, build.ExplicitDeps);
    // Write
    this->WriteBuild(os, build);
  }
}